

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::ByteSizeLong
          (BiDirectionalLSTMLayerParams *this)

{
  Rep *pRVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  void **ppvVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  lVar7 = (long)(this->activationsforwardlstm_).super_RepeatedPtrFieldBase.current_size_;
  pRVar1 = (this->activationsforwardlstm_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  lVar8 = lVar7 * 8;
  for (lVar6 = 0; lVar8 - lVar6 != 0; lVar6 = lVar6 + 8) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::ActivationParams>
                      (*(ActivationParams **)((long)ppvVar5 + lVar6));
    lVar7 = lVar7 + sVar2;
  }
  lVar8 = (long)(this->activationsbackwardlstm_).super_RepeatedPtrFieldBase.current_size_;
  lVar7 = lVar7 + lVar8;
  pRVar1 = (this->activationsbackwardlstm_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  for (lVar6 = 0; lVar8 * 8 != lVar6; lVar6 = lVar6 + 8) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::ActivationParams>
                      (*(ActivationParams **)((long)ppvVar5 + lVar6));
    lVar7 = lVar7 + sVar2;
  }
  lVar8 = (long)(this->weightparams_).super_RepeatedPtrFieldBase.current_size_;
  sVar2 = lVar7 + lVar8 * 2;
  pRVar1 = (this->weightparams_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  for (lVar7 = 0; lVar8 * 8 != lVar7; lVar7 = lVar7 + 8) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::LSTMWeightParams>
                      (*(LSTMWeightParams **)((long)ppvVar5 + lVar7));
    sVar2 = sVar2 + sVar3;
  }
  if (this != (BiDirectionalLSTMLayerParams *)_BiDirectionalLSTMLayerParams_default_instance_ &&
      this->params_ != (LSTMParams *)0x0) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::LSTMParams>(this->params_);
    sVar2 = sVar2 + sVar3 + 1;
  }
  if (this->inputvectorsize_ != 0) {
    uVar4 = this->inputvectorsize_ | 1;
    lVar7 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    sVar2 = sVar2 + ((int)lVar7 * 9 + 0x89U >> 6);
  }
  if (this->outputvectorsize_ != 0) {
    uVar4 = this->outputvectorsize_ | 1;
    lVar7 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    sVar2 = sVar2 + ((int)lVar7 * 9 + 0x89U >> 6);
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    sVar2 = sVar2 + *(long *)((uVar4 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar2;
  return sVar2;
}

Assistant:

size_t BiDirectionalLSTMLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BiDirectionalLSTMLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.ActivationParams activationsForwardLSTM = 10;
  total_size += 1UL * this->_internal_activationsforwardlstm_size();
  for (const auto& msg : this->activationsforwardlstm_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .CoreML.Specification.ActivationParams activationsBackwardLSTM = 11;
  total_size += 1UL * this->_internal_activationsbackwardlstm_size();
  for (const auto& msg : this->activationsbackwardlstm_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .CoreML.Specification.LSTMWeightParams weightParams = 20;
  total_size += 2UL * this->_internal_weightparams_size();
  for (const auto& msg : this->weightparams_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // .CoreML.Specification.LSTMParams params = 15;
  if (this->_internal_has_params()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *params_);
  }

  // uint64 inputVectorSize = 1;
  if (this->_internal_inputvectorsize() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_inputvectorsize());
  }

  // uint64 outputVectorSize = 2;
  if (this->_internal_outputvectorsize() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_outputvectorsize());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}